

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  float fVar1;
  value_type pLVar2;
  bool bVar3;
  Layer *pLVar4;
  reference ppLVar5;
  float *pfVar6;
  undefined8 *in_RSI;
  long in_RDI;
  Mat int8_weight_data_n;
  Mat weight_data_n;
  Option opt_q;
  ParamDict pd_2;
  Layer *op;
  int n_1;
  int weight_data_size_output;
  Mat int8_weight_data;
  Mat weights [1];
  ParamDict pd_1;
  float top_rescale;
  int n;
  ParamDict pd;
  bool weight_data_is_float32;
  bool weight_data_is_int8;
  Mat *in_stack_ffffffffffffe278;
  Mat *in_stack_ffffffffffffe280;
  Layer *in_stack_ffffffffffffe288;
  ParamDict *in_stack_ffffffffffffe290;
  Mat *this_00;
  undefined7 in_stack_ffffffffffffe298;
  undefined1 in_stack_ffffffffffffe29f;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_ffffffffffffe2a0;
  ParamDict *in_stack_ffffffffffffe2c0;
  Mat *local_1d28;
  Mat *local_1d00;
  bool local_1cd3;
  bool local_1cd2;
  bool local_1cd1;
  undefined1 local_1cc8 [64];
  undefined1 local_1c88 [64];
  undefined8 local_1c48;
  Allocator *pAStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  ParamDict local_1c20;
  Layer *local_1320;
  int local_1314;
  int local_1310;
  int local_130c;
  Mat local_1308;
  undefined1 local_12c8 [80];
  Mat local_1278;
  ParamDict local_1238;
  float local_934;
  int local_930;
  ParamDict local_920;
  byte local_1a;
  undefined1 local_19;
  undefined8 *local_18;
  int local_4;
  
  local_19 = *(long *)(in_RDI + 0xe8) == 1;
  local_1a = *(long *)(in_RDI + 0xe8) == 4;
  if (((bool)local_19) && ((*(byte *)((long)in_RSI + 0x1a) & 1) == 0)) {
    fprintf(_stderr,"quantized int8 weight loaded but use_int8_inference disabled\n");
    local_4 = -1;
  }
  else {
    local_1cd1 = false;
    if ((*(byte *)((long)in_RSI + 0x1a) & 1) != 0) {
      local_1cd2 = true;
      if (!(bool)local_19) {
        local_1cd3 = false;
        if ((bool)local_1a) {
          local_1cd3 = *(int *)(in_RDI + 0x8c) != 0;
        }
        local_1cd2 = local_1cd3;
      }
      local_1cd1 = local_1cd2;
    }
    *(bool *)(in_RDI + 0x19c) = local_1cd1;
    local_18 = in_RSI;
    if ((*(byte *)(in_RDI + 0x19c) & 1) != 0) {
      pLVar4 = create_layer((int)((ulong)in_stack_ffffffffffffe288 >> 0x20));
      *(Layer **)(in_RDI + 0x1a0) = pLVar4;
      ParamDict::ParamDict(in_stack_ffffffffffffe2c0);
      ParamDict::set(&local_920,0,*(float *)(in_RDI + 0x198));
      (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x10))(*(long **)(in_RDI + 0x1a0),&local_920);
      (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x20))(*(long **)(in_RDI + 0x1a0),local_18);
      ParamDict::~ParamDict(in_stack_ffffffffffffe290);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                (in_stack_ffffffffffffe2a0,
                 CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298));
      for (local_930 = 0; local_930 < *(int *)(in_RDI + 0x80); local_930 = local_930 + 1) {
        pLVar4 = create_layer((int)((ulong)in_stack_ffffffffffffe288 >> 0x20));
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1a8),(long)local_930);
        *ppLVar5 = pLVar4;
        local_934 = 1.0;
        pfVar6 = Mat::operator[]((Mat *)(in_RDI + 0x158),local_930);
        if ((*pfVar6 != 0.0) || (NAN(*pfVar6))) {
          fVar1 = *(float *)(in_RDI + 0x198);
          pfVar6 = Mat::operator[]((Mat *)(in_RDI + 0x158),local_930);
          local_934 = 1.0 / (fVar1 * *pfVar6);
        }
        else {
          local_934 = 0.0;
        }
        ParamDict::ParamDict(in_stack_ffffffffffffe2c0);
        ParamDict::set(&local_1238,0,local_934);
        ParamDict::set(&local_1238,1,*(int *)(in_RDI + 0x84));
        ParamDict::set(&local_1238,2,1);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1a8),(long)local_930);
        (*(*ppLVar5)->_vptr_Layer[2])(*ppLVar5,&local_1238);
        local_1d00 = &local_1278;
        do {
          Mat::Mat(local_1d00);
          local_1d00 = local_1d00 + 1;
        } while (local_1d00 != (Mat *)&local_1238);
        Mat::range((Mat *)in_stack_ffffffffffffe288,(int)((ulong)in_stack_ffffffffffffe280 >> 0x20),
                   (int)in_stack_ffffffffffffe280);
        Mat::operator=((Mat *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280);
        Mat::~Mat((Mat *)0x1639f3);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1a8),(long)local_930);
        pLVar2 = *ppLVar5;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)in_stack_ffffffffffffe280,in_stack_ffffffffffffe278);
        (*pLVar2->_vptr_Layer[3])(pLVar2,local_12c8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x163a53);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1a8),(long)local_930);
        (*(*ppLVar5)->_vptr_Layer[4])(*ppLVar5,local_18);
        local_1d28 = (Mat *)&local_1238;
        do {
          local_1d28 = local_1d28 + -1;
          Mat::~Mat((Mat *)0x163aae);
        } while (local_1d28 != &local_1278);
        ParamDict::~ParamDict(in_stack_ffffffffffffe290);
      }
    }
    if (((local_1a & 1) != 0) && ((*(byte *)(in_RDI + 0x19c) & 1) != 0)) {
      this_00 = &local_1308;
      Mat::Mat(this_00,(int)((ulong)in_stack_ffffffffffffe288 >> 0x20),
               (size_t)in_stack_ffffffffffffe280,(Allocator *)in_stack_ffffffffffffe278);
      bVar3 = Mat::empty(in_stack_ffffffffffffe280);
      if (bVar3) {
        local_4 = -100;
        local_130c = 1;
      }
      else {
        local_1310 = *(int *)(in_RDI + 0x88) / *(int *)(in_RDI + 0x80);
        for (local_1314 = 0; local_1314 < *(int *)(in_RDI + 0x80); local_1314 = local_1314 + 1) {
          in_stack_ffffffffffffe288 = create_layer((int)((ulong)in_stack_ffffffffffffe288 >> 0x20));
          local_1320 = in_stack_ffffffffffffe288;
          ParamDict::ParamDict(in_stack_ffffffffffffe2c0);
          in_stack_ffffffffffffe280 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x158),local_1314);
          ParamDict::set(&local_1c20,0,*(float *)&in_stack_ffffffffffffe280->data);
          (*local_1320->_vptr_Layer[2])(local_1320,&local_1c20);
          (*local_1320->_vptr_Layer[4])(local_1320,local_18);
          local_1c28 = local_18[4];
          local_1c48 = *local_18;
          local_1c38 = local_18[2];
          uStack_1c30 = local_18[3];
          pAStack_1c40 = local_1308.allocator;
          Mat::range((Mat *)in_stack_ffffffffffffe288,
                     (int)((ulong)in_stack_ffffffffffffe280 >> 0x20),(int)in_stack_ffffffffffffe280)
          ;
          Mat::range((Mat *)in_stack_ffffffffffffe288,
                     (int)((ulong)in_stack_ffffffffffffe280 >> 0x20),(int)in_stack_ffffffffffffe280)
          ;
          (*local_1320->_vptr_Layer[7])(local_1320,local_1c88,local_1cc8,&local_1c48);
          if (local_1320 != (Layer *)0x0) {
            (*local_1320->_vptr_Layer[1])();
          }
          Mat::~Mat((Mat *)0x163e62);
          Mat::~Mat((Mat *)0x163e6f);
          ParamDict::~ParamDict((ParamDict *)this_00);
        }
        Mat::operator=((Mat *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280);
        local_130c = 0;
      }
      Mat::~Mat((Mat *)0x163f31);
      if (local_130c != 0) {
        return local_4;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    // initial the quantize,dequantize op layer
    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->create_pipeline(opt);
        }

        dequantize_ops.resize(num_output);
        for (int n=0; n<num_output; n++)
        {
            dequantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;

            if (weight_data_int8_scales[n] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);  // bias_term
            pd.set(2, 1);          // bias_data_size

            dequantize_ops[n]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(n, 1);

            dequantize_ops[n]->load_model(ModelBinFromMatArray(weights));

            dequantize_ops[n]->create_pipeline(opt);
        }
    }

    // runtime quantize the weight data
    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int n=0; n<num_output; n++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[n]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * n, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * n, weight_data_size_output);
            op->forward(weight_data_n, int8_weight_data_n, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    return 0;
}